

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

void CVmObjString::add_to_str(vm_val_t *result,vm_val_t *self,vm_val_t *val)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t vVar4;
  ushort *puVar5;
  ushort *puVar6;
  char *pcVar7;
  ulong __n;
  ulong __n_00;
  vm_datatype_t vVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  vm_val_t new_obj2;
  char buf [128];
  
  puVar5 = (ushort *)vm_val_t::get_as_string(self);
  puVar6 = (ushort *)cvt_to_str(&new_obj2,buf,0x80,val,10,0);
  __n_00 = (ulong)*puVar6;
  if ((__n_00 == 0) || (val->typ == VM_NIL)) {
    vVar8 = self->typ;
    uVar9 = *(undefined4 *)&self->field_0x4;
    vVar4 = (self->val).obj;
    uVar10 = *(undefined4 *)((long)&self->val + 4);
LAB_002752c9:
    result->typ = vVar8;
    *(undefined4 *)&result->field_0x4 = uVar9;
    (result->val).obj = vVar4;
    *(undefined4 *)((long)&result->val + 4) = uVar10;
  }
  else {
    __n = (ulong)*puVar5;
    if (__n == 0) {
      pcVar7 = vm_val_t::get_as_string(val);
      if (pcVar7 != (char *)0x0) {
        vVar8 = val->typ;
        uVar9 = *(undefined4 *)&val->field_0x4;
        vVar4 = (val->val).obj;
        uVar10 = *(undefined4 *)((long)&val->val + 4);
        goto LAB_002752c9;
      }
    }
    pvVar3 = sp_;
    uVar9 = *(undefined4 *)&self->field_0x4;
    aVar2 = self->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar9;
    pvVar3->val = aVar2;
    pvVar3 = sp_;
    sp_ = sp_ + 1;
    pvVar3->typ = new_obj2.typ;
    *(undefined4 *)&pvVar3->field_0x4 = new_obj2._4_4_;
    pvVar3->val = new_obj2.val;
    vVar4 = create(0,__n_00 + __n);
    pCVar1 = G_obj_table_X.pages_[vVar4 >> 0xc];
    memcpy((void *)(*(long *)((long)&pCVar1[vVar4 & 0xfff].ptr_ + 8) + 2),puVar5 + 1,__n);
    memcpy((void *)(*(long *)((long)&pCVar1[vVar4 & 0xfff].ptr_ + 8) + __n + 2),puVar6 + 1,__n_00);
    sp_ = sp_ + -2;
    result->typ = VM_OBJ;
    (result->val).obj = vVar4;
  }
  return;
}

Assistant:

void CVmObjString::add_to_str(VMG_ vm_val_t *result,
                              const vm_val_t *self, const vm_val_t *val)
{
    const char *strval1, *strval2;
    char buf[128];
    vm_obj_id_t obj;
    size_t len1, len2;
    CVmObjString *objptr;
    vm_val_t new_obj2;

    /* 
     *   Get the string buffer pointers.  The left value is already a string,
     *   or we wouldn't be here.  The right value can be anything, though, so
     *   we need to apply an implicit string conversion if it's another type.
     */
    strval1 = self->get_as_string(vmg0_);
    strval2 = cvt_to_str(vmg_ &new_obj2, buf, sizeof(buf), val, 10, 0);

    /* get the lengths of the two strings */
    len1 = vmb_get_len(strval1);
    len2 = vmb_get_len(strval2);

    /*
     *   If the right-hand value is zero length, or it's nil, simply return
     *   the left-hand value.  If the left-hand value is zero length AND the
     *   right-hand value is already a string (constant or object), return
     *   the right-hand value unchanged.  Otherwise, we actually need to
     *   build a whole new string with the concatenated texts.  
     */
    if (len2 == 0 || val->typ == VM_NIL)
    {
        /* we're appending nothing to the string; just return 'self' */
        *result = *self;
    }
    else if (len1 == 0 && val->get_as_string(vmg0_) != 0)
    {
        /* 
         *   we're appending the right value to an empty string, AND the
         *   right value is already a string itself, so we can simply return
         *   the right value unchanged 
         */
        *result = *val;
    }
    else
    {
        /* 
         *   push the new string (if any) and self, to protect the two
         *   strings from garbage collection 
         */
        G_stk->push(self);
        G_stk->push(&new_obj2);

        /* create a new string object to hold the result */
        obj = create(vmg_ FALSE, len1 + len2);
        objptr = (CVmObjString *)vm_objp(vmg_ obj);

        /* copy the two strings into the new object's string buffer */
        objptr->copy_into_str(0, strval1 + VMB_LEN, len1);
        objptr->copy_into_str(len1, strval2 + VMB_LEN, len2);

        /* we're done with the garbage collection protection */
        G_stk->discard(2);

        /* return the new object in the result */
        result->set_obj(obj);
    }
}